

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

Token * __thiscall Lexer::match_equal(Token *__return_storage_ptr__,Lexer *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Type TVar4;
  
  advance(this);
  if (this->current_ == '=') {
    advance(this);
    skip_whitespace(this);
    iVar3 = 2;
    TVar4 = kEqual;
  }
  else {
    iVar3 = 1;
    TVar4 = kAssign;
  }
  iVar1 = (this->position_).super_Position.row_;
  iVar2 = (this->position_).super_Position.col_;
  __return_storage_ptr__->type_ = TVar4;
  (__return_storage_ptr__->content_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->content_).field_2;
  (__return_storage_ptr__->content_)._M_string_length = 0;
  (__return_storage_ptr__->content_).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->position_).super_Position.row_ = iVar1;
  (__return_storage_ptr__->position_).super_Position.col_ = iVar2;
  (__return_storage_ptr__->position_).super_Position._vptr_Position =
       (_func_int **)&PTR_clear_001539d0;
  (__return_storage_ptr__->position_).length_ = iVar3;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::match_equal() {
    consume(false);
    if (current_ == '=') {
        consume();
        return Token(Token::Type::kEqual, TokenPosition(position_, 2));
    } else {
        return Token(Token::Type::kAssign, TokenPosition(position_, 1));
    }
}